

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TernaryExpression.hpp
# Opt level: O0

void __thiscall
Kandinsky::TernaryExpression::fillVariableSet
          (TernaryExpression *this,
          set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *variableSet,BaseExpressionPtr *param_3)

{
  element_type *peVar1;
  undefined8 in_RSI;
  long in_RDI;
  
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x137e46);
  (*peVar1->_vptr_BaseExpression[4])(peVar1,in_RSI,in_RDI + 8);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x137e6b);
  (*peVar1->_vptr_BaseExpression[4])(peVar1,in_RSI,in_RDI + 0x18);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x137e90);
  (*peVar1->_vptr_BaseExpression[4])(peVar1,in_RSI,in_RDI + 0x28);
  return;
}

Assistant:

virtual void fillVariableSet(std::set<Variable, VariableLessThanComparator>& variableSet, const BaseExpressionPtr& /*thisSharedPtr*/) const
        {
            m_arg1->fillVariableSet(variableSet, m_arg1);
            m_arg2->fillVariableSet(variableSet, m_arg2);
            m_arg3->fillVariableSet(variableSet, m_arg3);
        }